

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O1

unique_ptr<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
__thiscall
wabt::
MakeUnique<wabt::LexerSourceLineFinder,std::unique_ptr<wabt::LexerSource,std::default_delete<wabt::LexerSource>>>
          (wabt *this,unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_> *args)

{
  LexerSourceLineFinder *this_00;
  pointer *__ptr;
  _Head_base<0UL,_wabt::LexerSource_*,_false> local_28;
  
  this_00 = (LexerSourceLineFinder *)operator_new(0x30);
  local_28._M_head_impl =
       (args->_M_t).
       super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>._M_t.
       super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>.
       super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl;
  (args->_M_t).super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>.
  _M_t.super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>.
  super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl = (LexerSource *)0x0;
  LexerSourceLineFinder::LexerSourceLineFinder
            (this_00,(unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_> *)
                     &local_28);
  *(LexerSourceLineFinder **)this = this_00;
  if (local_28._M_head_impl != (LexerSource *)0x0) {
    operator_delete(local_28._M_head_impl);
  }
  return (__uniq_ptr_data<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>,_true,_true>
          )(__uniq_ptr_data<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}